

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::LinearQuantizationParams::_internal_add_bias
          (LinearQuantizationParams *this,float value)

{
  float local_4;
  
  google::protobuf::RepeatedField<float>::Add(&this->bias_,&local_4);
  return;
}

Assistant:

inline void LinearQuantizationParams::_internal_add_bias(float value) {
  bias_.Add(value);
}